

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O1

csc * triplet_to_csc(csc *T,c_int *TtoC)

{
  long *plVar1;
  size_t __nmemb;
  c_int *pcVar2;
  c_int *pcVar3;
  c_float *pcVar4;
  long nzmax;
  c_int *pcVar5;
  c_int *pcVar6;
  c_float *pcVar7;
  long lVar8;
  long lVar9;
  csc *A;
  void *__ptr;
  long lVar10;
  c_int cVar11;
  size_t sVar12;
  
  __nmemb = T->n;
  pcVar2 = T->i;
  pcVar3 = T->p;
  pcVar4 = T->x;
  nzmax = T->nz;
  A = csc_spalloc(T->m,__nmemb,nzmax,(ulong)(pcVar4 != (c_float *)0x0),0);
  __ptr = calloc(__nmemb,8);
  if (A == (csc *)0x0 || __ptr == (void *)0x0) {
    free(__ptr);
    csc_spfree(A);
    A = (csc *)0x0;
  }
  else {
    pcVar5 = A->p;
    if (0 < nzmax) {
      lVar10 = 0;
      do {
        plVar1 = (long *)((long)__ptr + pcVar3[lVar10] * 8);
        *plVar1 = *plVar1 + 1;
        lVar10 = lVar10 + 1;
      } while (nzmax != lVar10);
    }
    pcVar6 = A->i;
    pcVar7 = A->x;
    if (pcVar5 != (c_int *)0x0) {
      if ((long)__nmemb < 1) {
        cVar11 = 0;
      }
      else {
        sVar12 = 0;
        lVar10 = 0;
        do {
          pcVar5[sVar12] = lVar10;
          cVar11 = *(long *)((long)__ptr + sVar12 * 8) + lVar10;
          *(long *)((long)__ptr + sVar12 * 8) = lVar10;
          sVar12 = sVar12 + 1;
          lVar10 = cVar11;
        } while (__nmemb != sVar12);
      }
      pcVar5[__nmemb] = cVar11;
    }
    if (0 < nzmax) {
      lVar10 = 0;
      do {
        lVar8 = pcVar3[lVar10];
        lVar9 = *(long *)((long)__ptr + lVar8 * 8);
        cVar11 = pcVar2[lVar10];
        *(long *)((long)__ptr + lVar8 * 8) = lVar9 + 1;
        pcVar6[lVar9] = cVar11;
        if ((pcVar7 != (c_float *)0x0) && (pcVar7[lVar9] = pcVar4[lVar10], TtoC != (c_int *)0x0)) {
          TtoC[lVar10] = lVar9;
        }
        lVar10 = lVar10 + 1;
      } while (nzmax != lVar10);
    }
    free(__ptr);
  }
  return A;
}

Assistant:

csc* triplet_to_csc(const csc *T, c_int *TtoC) {
  c_int m, n, nz, p, k, *Cp, *Ci, *w, *Ti, *Tj;
  c_float *Cx, *Tx;
  csc     *C;

  m  = T->m;
  n  = T->n;
  Ti = T->i;
  Tj = T->p;
  Tx = T->x;
  nz = T->nz;
  C  = csc_spalloc(m, n, nz, Tx != OSQP_NULL, 0);     /* allocate result */
  w  = csc_calloc(n, sizeof(c_int));                  /* get workspace */

  if (!C || !w) return csc_done(C, w, OSQP_NULL, 0);  /* out of memory */

  Cp = C->p;
  Ci = C->i;
  Cx = C->x;

  for (k = 0; k < nz; k++) w[Tj[k]]++;  /* column counts */
  csc_cumsum(Cp, w, n);                 /* column pointers */

  for (k = 0; k < nz; k++) {
    Ci[p = w[Tj[k]]++] = Ti[k];         /* A(i,j) is the pth entry in C */

    if (Cx) {
      Cx[p] = Tx[k];

      if (TtoC != OSQP_NULL) TtoC[k] = p;  // Assign vector of indices
    }
  }
  return csc_done(C, w, OSQP_NULL, 1);     /* success; free w and return C */
}